

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O2

void pstore::broker::uptime(not_null<std::atomic<bool>_*> done)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  double __x;
  double __x_00;
  long *local_208;
  time_point until;
  not_null<const_char_*> local_1f8;
  not_null<const_char_*> local_1f0;
  value_type local_1e8;
  string local_1c8;
  ostringstream os;
  
  local_1f0.ptr_ = "uptime 1 second tick starting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_1f0);
  log((pstore *)0x6,__x);
  until.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_208 = (long *)(uptime_channel + 0x40);
  while( true ) {
    do {
      if ((((done.ptr_)->_M_base)._M_i & 1U) != 0) {
        local_1f8.ptr_ = "uptime thread exiting";
        pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_1f8);
        log((pstore *)0x6,__x_00);
        return;
      }
      until.__d.__r = (duration)((long)until.__d.__r + 1000000000);
      std::this_thread::
      sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&until);
      bVar1 = brokerface::channel<pstore::descriptor_condition_variable>::have_listeners
                        ((channel<pstore::descriptor_condition_variable> *)uptime_channel);
    } while (!bVar1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar2 = std::operator<<((ostream *)&os,"{ \"uptime\": ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," }");
    std::__cxx11::stringbuf::str();
    bVar1 = json::is_valid(&local_1c8);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_1e8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    std::mutex::lock((mutex *)uptime_channel);
    plVar3 = local_208;
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)plVar3[1],&local_1e8);
    }
    descriptor_condition_variable::notify_all
              ((descriptor_condition_variable *)uptime_channel._40_8_);
    pthread_mutex_unlock((pthread_mutex_t *)uptime_channel);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  assert_failed("json::is_valid (str)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/uptime.cpp"
                ,0x2d);
}

Assistant:

void uptime (gsl::not_null<std::atomic<bool> *> const done) {
            log (logger::priority::info, "uptime 1 second tick starting");

            auto seconds = std::uint64_t{0};
            auto until = std::chrono::system_clock::now ();
            while (!*done) {
                until += std::chrono::seconds{1};
                std::this_thread::sleep_until (until);
                ++seconds;

                uptime_channel.publish ([seconds] () {
                    std::ostringstream os;
                    os << "{ \"uptime\": " << seconds << " }";
                    std::string const & str = os.str ();
                    PSTORE_ASSERT (json::is_valid (str));
                    return str;
                });
            }

            log (logger::priority::info, "uptime thread exiting");
        }